

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O3

void __thiscall FIX::Session::generateHeartbeat(Session *this)

{
  Message heartbeat;
  long *local_1e0;
  long local_1d8;
  long local_1d0 [2];
  undefined1 local_1c0 [16];
  _Alloc_hider local_1b0;
  char local_1a0 [16];
  _Alloc_hider local_190;
  size_type local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180;
  field_metrics local_170;
  Message local_168;
  
  local_1e0 = local_1d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,&MsgType_Heartbeat,0x1cd8af);
  local_1c0._0_8_ = &PTR__FieldBase_001f55c8;
  local_1c0._8_4_ = 0x23;
  local_1b0._M_p = local_1a0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1b0,local_1e0,local_1d8 + (long)local_1e0);
  local_190._M_p = (pointer)&local_180;
  local_188 = 0;
  local_180._M_local_buf[0] = '\0';
  local_170.m_length = 0;
  local_170.m_checksum = 0;
  local_1c0._0_8_ = &PTR__FieldBase_001f6658;
  newMessage(&local_168,this,(MsgType *)local_1c0);
  FieldBase::~FieldBase((FieldBase *)local_1c0);
  if (local_1e0 != local_1d0) {
    operator_delete(local_1e0,local_1d0[0] + 1);
  }
  fill(this,&local_168.m_header);
  sendRaw(this,&local_168,0);
  Message::~Message(&local_168);
  return;
}

Assistant:

void Session::generateHeartbeat() {
  Message heartbeat = newMessage(MsgType(MsgType_Heartbeat));

  fill(heartbeat.getHeader());
  sendRaw(heartbeat);
}